

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase173::run(TestCase173 *this)

{
  Builder builder;
  bool bVar1;
  Type *func;
  undefined8 in_stack_fffffffffffffc00;
  Maybe<kj::Exception> *__return_storage_ptr__;
  bool local_3e9;
  undefined1 *puStack_3e8;
  bool _kj_shouldLog;
  StructDataBitCount *local_3e0;
  Maybe<kj::Exception> local_3d8;
  Builder local_278;
  undefined1 local_250 [8];
  Builder root2;
  Builder root1;
  undefined1 local_1f0 [8];
  MallocMessageBuilder builder2;
  MallocMessageBuilder builder1;
  TestCase173 *this_local;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&builder2.moreSegments.builder.disposer,0x400,
             GROW_HEURISTICALLY);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_1f0,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)&root2._builder.dataSize,
             (MessageBuilder *)&builder2.moreSegments.builder.disposer);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_250,(MessageBuilder *)local_1f0);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField
            (&local_278,(Builder *)&root2._builder.dataSize);
  builder._builder.capTable = (CapTableBuilder *)local_278._builder.data;
  builder._builder.segment = (SegmentBuilder *)local_278._builder.capTable;
  builder._builder.data = local_278._builder.pointers;
  builder._builder.pointers = (WirePointer *)local_278._builder._32_8_;
  builder._builder.dataSize = (int)in_stack_fffffffffffffc00;
  builder._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffc00 >> 0x20);
  builder._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffc00 >> 0x30);
  initTestMessage(builder);
  puStack_3e8 = local_250;
  local_3e0 = &root2._builder.dataSize;
  __return_storage_ptr__ = &local_3d8;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase173::run()::__0>
            (__return_storage_ptr__,(kj *)&stack0xfffffffffffffc18,func);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(__return_storage_ptr__,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_3d8);
  if (!bVar1) {
    local_3e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_3e9 != false) {
      kj::_::Debug::log<char_const(&)[118]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0xb5,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root2.adoptStructField(root1.disownStructField()); }) != nullptr\""
                 ,(char (*) [118])
                  "failed: expected ::kj::runCatchingExceptions([&]() { root2.adoptStructField(root1.disownStructField()); }) != nullptr"
                );
      local_3e9 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_1f0);
  MallocMessageBuilder::~MallocMessageBuilder
            ((MallocMessageBuilder *)&builder2.moreSegments.builder.disposer);
  return;
}

Assistant:

TEST(Orphans, NoCrossMessageTransfers) {
  MallocMessageBuilder builder1;
  MallocMessageBuilder builder2;
  auto root1 = builder1.initRoot<TestAllTypes>();
  auto root2 = builder2.initRoot<TestAllTypes>();

  initTestMessage(root1.initStructField());

  EXPECT_ANY_THROW(root2.adoptStructField(root1.disownStructField()));
}